

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraCodeBlocksGenerator::AppendTarget
          (cmExtraCodeBlocksGenerator *this,cmXMLWriter *xml,string *targetName,
          cmGeneratorTarget *target,string *make,cmLocalGenerator *lg,string *compiler,
          string *makeFlags)

{
  TargetType TVar1;
  string *psVar2;
  char *pcVar3;
  const_iterator cVar4;
  cmXMLWriter *this_00;
  string *str;
  pointer pbVar5;
  pointer __rhs;
  string systemIncludeDirs;
  string buildType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  int cbTargetType;
  string location;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allIncludeDirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cdefs;
  string makefileName;
  allocator<char> local_159;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  cmGeneratorTarget *local_d8;
  cmMakefile *local_d0;
  cmLocalGenerator *local_c8;
  cmExtraCodeBlocksGenerator *local_c0;
  string *local_b8;
  int local_ac;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  local_d0 = lg->Makefile;
  local_d8 = target;
  local_c8 = lg;
  local_c0 = this;
  local_b8 = make;
  local_70 = targetName;
  psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(lg);
  std::__cxx11::string::string((string *)&local_50,(string *)psVar2);
  std::__cxx11::string::append((char *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"Target",(allocator<char> *)&local_118);
  cmXMLWriter::StartElement(xml,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  this_00 = xml;
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"title",local_70);
  if (local_d8 == (cmGeneratorTarget *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"Option",(allocator<char> *)&local_118);
    cmXMLWriter::StartElement(xml,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(local_c8);
    cmXMLWriter::Attribute<std::__cxx11::string>(xml,"working_dir",psVar2);
    cmXMLWriter::EndElement(xml);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"Option",(allocator<char> *)&local_118);
    cmXMLWriter::StartElement(xml,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    local_158._M_dataplus._M_p._0_4_ = 4;
    cmXMLWriter::Attribute<int>(xml,"type",(int *)&local_158);
    cmXMLWriter::EndElement(xml);
  }
  else {
    local_ac = GetCBTargetType((cmExtraCodeBlocksGenerator *)this_00,local_d8);
    psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(local_c8);
    std::__cxx11::string::string((string *)&local_158,(string *)psVar2);
    TVar1 = cmGeneratorTarget::GetType(local_d8);
    if (TVar1 == EXECUTABLE) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"CMAKE_RUNTIME_OUTPUT_DIRECTORY",(allocator<char> *)&local_a8)
      ;
      pcVar3 = cmMakefile::GetDefinition(local_d0,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      if (pcVar3 == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"EXECUTABLE_OUTPUT_PATH",(allocator<char> *)&local_a8);
        pcVar3 = cmMakefile::GetDefinition(local_d0,&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        if (pcVar3 != (char *)0x0) {
          std::__cxx11::string::assign((char *)&local_158);
        }
      }
      else {
        std::__cxx11::string::assign((char *)&local_158);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"CMAKE_BUILD_TYPE",(allocator<char> *)&local_138);
    psVar2 = cmMakefile::GetSafeDefinition(local_d0,&local_a8);
    std::__cxx11::string::string((string *)&local_118,(string *)psVar2);
    std::__cxx11::string::~string((string *)&local_a8);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
    TVar1 = cmGeneratorTarget::GetType(local_d8);
    if (TVar1 == OBJECT_LIBRARY) {
      CreateDummyTargetFile_abi_cxx11_
                (&local_138,(cmExtraCodeBlocksGenerator *)psVar2,local_c8,local_d8);
      std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_138);
      std::__cxx11::string::~string((string *)&local_138);
    }
    else {
      cmGeneratorTarget::GetLocation(local_d8,&local_118);
      std::__cxx11::string::assign((char *)&local_a8);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"Option",(allocator<char> *)&local_f8);
    cmXMLWriter::StartElement(xml,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    cmXMLWriter::Attribute<std::__cxx11::string>(xml,"output",&local_a8);
    local_138._M_dataplus._M_p._0_4_ = 0;
    cmXMLWriter::Attribute<int>(xml,"prefix_auto",(int *)&local_138);
    local_138._M_dataplus._M_p._0_4_ = 0;
    cmXMLWriter::Attribute<int>(xml,"extension_auto",(int *)&local_138);
    cmXMLWriter::EndElement(xml);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"Option",(allocator<char> *)&local_f8);
    cmXMLWriter::StartElement(xml,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    cmXMLWriter::Attribute<std::__cxx11::string>(xml,"working_dir",&local_158);
    cmXMLWriter::EndElement(xml);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"Option",(allocator<char> *)&local_f8);
    cmXMLWriter::StartElement(xml,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    cmXMLWriter::Attribute<char[3]>(xml,"object_output",(char (*) [3])0x434a1a);
    cmXMLWriter::EndElement(xml);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"Option",(allocator<char> *)&local_f8);
    cmXMLWriter::StartElement(xml,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    cmXMLWriter::Attribute<int>(xml,"type",&local_ac);
    cmXMLWriter::EndElement(xml);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"Option",(allocator<char> *)&local_f8);
    cmXMLWriter::StartElement(xml,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    cmXMLWriter::Attribute<std::__cxx11::string>(xml,"compiler",compiler);
    cmXMLWriter::EndElement(xml);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"Compiler",(allocator<char> *)&local_f8);
    cmXMLWriter::StartElement(xml,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"C",(allocator<char> *)&local_f8);
    cmGeneratorTarget::GetCompileDefinitions(local_d8,&local_68,&local_118,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    pbVar5 = local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__rhs = local_68.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __rhs != pbVar5; __rhs = __rhs + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"Add",(allocator<char> *)&local_f8);
      cmXMLWriter::StartElement(xml,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::operator+(&local_138,"-D",__rhs);
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,"option",&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      cmXMLWriter::EndElement(xml);
    }
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"C",&local_159);
    cmLocalGenerator::GetIncludeDirectories
              (local_c8,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_f8,local_d8,&local_138,&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_88,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_f8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"CMAKE_EXTRA_GENERATOR_CXX_SYSTEM_INCLUDE_DIRS",&local_159);
    psVar2 = cmMakefile::GetSafeDefinition(local_d0,&local_f8);
    std::__cxx11::string::string((string *)&local_138,(string *)psVar2);
    std::__cxx11::string::~string((string *)&local_f8);
    if (local_138._M_string_length != 0) {
      cmSystemTools::ExpandedListArgument
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_f8,&local_138,false);
      cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_88,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_f8);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"CMAKE_EXTRA_GENERATOR_C_SYSTEM_INCLUDE_DIRS",&local_159);
    cmMakefile::GetSafeDefinition(local_d0,&local_f8);
    std::__cxx11::string::_M_assign((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_f8);
    if (local_138._M_string_length != 0) {
      cmSystemTools::ExpandedListArgument
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_f8,&local_138,false);
      cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_88,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_f8);
    }
    cVar4 = cmRemoveDuplicates<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      (&local_88);
    for (pbVar5 = local_88.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar5 != cVar4._M_current;
        pbVar5 = pbVar5 + 1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"Add",&local_159);
      cmXMLWriter::StartElement(xml,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,"directory",pbVar5);
      cmXMLWriter::EndElement(xml);
    }
    cmXMLWriter::EndElement(xml);
    std::__cxx11::string::~string((string *)&local_138);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_158);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"MakeCommands",(allocator<char> *)&local_118);
  cmXMLWriter::StartElement(xml,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"Build",(allocator<char> *)&local_118);
  cmXMLWriter::StartElement(xml,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  BuildMakeCommand(&local_158,local_c0,local_b8,&local_50,local_70,makeFlags);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"command",&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  cmXMLWriter::EndElement(xml);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"CompileFile",(allocator<char> *)&local_118);
  cmXMLWriter::StartElement(xml,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"\"$file\"",(allocator<char> *)&local_a8);
  BuildMakeCommand(&local_158,local_c0,local_b8,&local_50,&local_118,makeFlags);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"command",&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_118);
  cmXMLWriter::EndElement(xml);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"Clean",(allocator<char> *)&local_118);
  cmXMLWriter::StartElement(xml,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"clean",(allocator<char> *)&local_a8);
  BuildMakeCommand(&local_158,local_c0,local_b8,&local_50,&local_118,makeFlags);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"command",&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_118);
  cmXMLWriter::EndElement(xml);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"DistClean",(allocator<char> *)&local_118);
  cmXMLWriter::StartElement(xml,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"clean",(allocator<char> *)&local_a8);
  BuildMakeCommand(&local_158,local_c0,local_b8,&local_50,&local_118,makeFlags);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"command",&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_118);
  cmXMLWriter::EndElement(xml);
  cmXMLWriter::EndElement(xml);
  cmXMLWriter::EndElement(xml);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator::AppendTarget(
  cmXMLWriter& xml, const std::string& targetName, cmGeneratorTarget* target,
  const std::string& make, const cmLocalGenerator* lg,
  const std::string& compiler, const std::string& makeFlags)
{
  cmMakefile const* makefile = lg->GetMakefile();
  std::string makefileName = lg->GetCurrentBinaryDirectory();
  makefileName += "/Makefile";

  xml.StartElement("Target");
  xml.Attribute("title", targetName);

  if (target != nullptr) {
    int cbTargetType = this->GetCBTargetType(target);
    std::string workingDir = lg->GetCurrentBinaryDirectory();
    if (target->GetType() == cmStateEnums::EXECUTABLE) {
      // Determine the directory where the executable target is created, and
      // set the working directory to this dir.
      const char* runtimeOutputDir =
        makefile->GetDefinition("CMAKE_RUNTIME_OUTPUT_DIRECTORY");
      if (runtimeOutputDir != nullptr) {
        workingDir = runtimeOutputDir;
      } else {
        const char* executableOutputDir =
          makefile->GetDefinition("EXECUTABLE_OUTPUT_PATH");
        if (executableOutputDir != nullptr) {
          workingDir = executableOutputDir;
        }
      }
    }

    std::string buildType = makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
    std::string location;
    if (target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      location =
        this->CreateDummyTargetFile(const_cast<cmLocalGenerator*>(lg), target);
    } else {
      location = target->GetLocation(buildType);
    }

    xml.StartElement("Option");
    xml.Attribute("output", location);
    xml.Attribute("prefix_auto", 0);
    xml.Attribute("extension_auto", 0);
    xml.EndElement();

    xml.StartElement("Option");
    xml.Attribute("working_dir", workingDir);
    xml.EndElement();

    xml.StartElement("Option");
    xml.Attribute("object_output", "./");
    xml.EndElement();

    xml.StartElement("Option");
    xml.Attribute("type", cbTargetType);
    xml.EndElement();

    xml.StartElement("Option");
    xml.Attribute("compiler", compiler);
    xml.EndElement();

    xml.StartElement("Compiler");

    // the compilerdefines for this target
    std::vector<std::string> cdefs;
    target->GetCompileDefinitions(cdefs, buildType, "C");

    // Expand the list.
    for (std::string const& d : cdefs) {
      xml.StartElement("Add");
      xml.Attribute("option", "-D" + d);
      xml.EndElement();
    }

    // the include directories for this target
    std::vector<std::string> allIncludeDirs;
    {
      std::vector<std::string> includes;
      lg->GetIncludeDirectories(includes, target, "C", buildType);
      cmAppend(allIncludeDirs, includes);
    }

    std::string systemIncludeDirs = makefile->GetSafeDefinition(
      "CMAKE_EXTRA_GENERATOR_CXX_SYSTEM_INCLUDE_DIRS");
    if (!systemIncludeDirs.empty()) {
      cmAppend(allIncludeDirs,
               cmSystemTools::ExpandedListArgument(systemIncludeDirs));
    }

    systemIncludeDirs = makefile->GetSafeDefinition(
      "CMAKE_EXTRA_GENERATOR_C_SYSTEM_INCLUDE_DIRS");
    if (!systemIncludeDirs.empty()) {
      cmAppend(allIncludeDirs,
               cmSystemTools::ExpandedListArgument(systemIncludeDirs));
    }

    std::vector<std::string>::const_iterator end =
      cmRemoveDuplicates(allIncludeDirs);

    for (std::string const& str : cmMakeRange(allIncludeDirs.cbegin(), end)) {
      xml.StartElement("Add");
      xml.Attribute("directory", str);
      xml.EndElement();
    }

    xml.EndElement(); // Compiler
  } else              // e.g. all and the GLOBAL and UTILITY targets
  {
    xml.StartElement("Option");
    xml.Attribute("working_dir", lg->GetCurrentBinaryDirectory());
    xml.EndElement();

    xml.StartElement("Option");
    xml.Attribute("type", 4);
    xml.EndElement();
  }

  xml.StartElement("MakeCommands");

  xml.StartElement("Build");
  xml.Attribute(
    "command",
    this->BuildMakeCommand(make, makefileName, targetName, makeFlags));
  xml.EndElement();

  xml.StartElement("CompileFile");
  xml.Attribute(
    "command",
    this->BuildMakeCommand(make, makefileName, "\"$file\"", makeFlags));
  xml.EndElement();

  xml.StartElement("Clean");
  xml.Attribute(
    "command", this->BuildMakeCommand(make, makefileName, "clean", makeFlags));
  xml.EndElement();

  xml.StartElement("DistClean");
  xml.Attribute(
    "command", this->BuildMakeCommand(make, makefileName, "clean", makeFlags));
  xml.EndElement();

  xml.EndElement(); // MakeCommands
  xml.EndElement(); // Target
}